

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *io;
  TValue k;
  TValue *cell;
  TValue *p;
  TValue *value_local;
  lua_Integer key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._8_8_ = luaH_getint(t,key);
  if ((TValue *)k._8_8_ == &luaO_nilobject_) {
    k.value_.b = 0x13;
    io = (TValue *)key;
    k._8_8_ = luaH_newkey(L,t,(TValue *)&io);
  }
  *(Value *)k._8_8_ = value->value_;
  *(undefined8 *)(k._8_8_ + 8) = *(undefined8 *)&value->tt_;
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  const TValue *p = luaH_getint(t, key);
  TValue *cell;
  if (p != luaO_nilobject)
    cell = cast(TValue *, p);
  else {
    TValue k;
    setivalue(&k, key);
    cell = luaH_newkey(L, t, &k);
  }
  setobj2t(L, cell, value);
}